

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AviWriter.cpp
# Opt level: O1

uint __thiscall AviWriter::addWord(AviWriter *this,uint word)

{
  putc(word & 0xff,(FILE *)this->fOutFid);
  putc(word >> 8 & 0xff,(FILE *)this->fOutFid);
  putc(word >> 0x10 & 0xff,(FILE *)this->fOutFid);
  putc(word >> 0x18,(FILE *)this->fOutFid);
  return 4;
}

Assistant:

unsigned AviWriter::addWord(unsigned word) {
    // Add "word" to the file in little-endian order:
    addByte(word); addByte(word>>8);
    addByte(word>>16); addByte(word>>24);

    return 4;
}